

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::adjust_spec_diffusion_fluxes(PeleLM *this,MultiFab **flux,MultiFab *S,BCRec *bc)

{
  double dVar1;
  int iVar2;
  EBCellFlagFab *this_00;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined8 uVar8;
  Long LVar9;
  Long LVar10;
  Long LVar11;
  Long LVar12;
  Long LVar13;
  Long LVar14;
  FabType FVar15;
  BoxArray *pBVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  ostream *os_;
  Print *pPVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint dir;
  int iVar26;
  int iVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar43;
  bool bVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  double *local_a30;
  int id_l [3];
  long local_a10;
  double *local_a08;
  double *local_a00;
  double *local_9d0;
  Box local_9c4;
  double *local_9a8;
  double *local_9a0;
  long local_998;
  long local_990;
  ulong local_988;
  long local_980;
  long local_978;
  long local_970;
  long local_968;
  double *local_960;
  long local_958;
  long local_950;
  long local_948;
  int local_93c [3];
  long *local_930;
  FabArray<amrex::FArrayBox> *local_928;
  BCRec *local_920;
  Box bx;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bc;
  int id_l_1 [3];
  undefined4 uStack_84c;
  long local_848;
  long lStack_840;
  long local_838;
  int iStack_830;
  int iStack_82c;
  int iStack_828;
  undefined8 uStack_824;
  Box result;
  int local_7f0;
  int iStack_7ec;
  int local_7b0;
  int iStack_7ac;
  long local_790;
  undefined8 uStack_788;
  long local_780;
  undefined4 uStack_778;
  int aiStack_774 [9];
  long local_750;
  long lStack_748;
  int local_730;
  int local_72c;
  int aiStack_710 [4];
  int iStack_700;
  int iStack_6fc;
  IndexType IStack_6f8;
  int local_6f4 [27];
  int id_h [3];
  undefined4 uStack_67c;
  long local_678;
  undefined8 local_668;
  int iStack_660;
  Array4<double> local_648;
  Array4<const_double> local_608;
  MFIter mfi;
  double local_568 [22];
  FabArray<amrex::FArrayBox> local_4b8;
  MultiFab local_338;
  MultiFab local_1b8;
  
  local_920 = bc;
  dVar45 = amrex::ParallelDescriptor::second();
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0x15,
             (allocator_type *)&local_4b8);
  NavierStokesBase::fetchBCArray
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_4b8,
             &this->super_NavierStokesBase,0,first_spec,0x15);
  this_01 = &local_4b8;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::_M_move_assign
            (&math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,this_01);
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
            ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)this_01);
  lVar29 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)((long)&local_4b8.super_FabArrayBase._vptr_FabArrayBase + lVar29));
    lVar29 = lVar29 + 0x180;
  } while (lVar29 != 0x480);
  for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
    pBVar16 = amrex::AmrLevel::getEdgeBoxArray((AmrLevel *)this,(int)lVar29);
    result.smallend.vect[0] = 1;
    result.smallend.vect[1] = 0;
    result.btype.itype = 0;
    result.smallend.vect[2] = 0;
    result.bigend.vect[0] = 0;
    result.bigend.vect[1] = 0;
    result.bigend.vect[2] = 0;
    (**(code **)(((_Vector_impl_data *)&(this_01->super_FabArrayBase)._vptr_FabArrayBase)->_M_start
                 ->bc + 4))
              (this_01,pBVar16,&(this->super_NavierStokesBase).super_AmrLevel.dmap,0x15,4,&result,
               (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(result.bigend.vect + 1));
    this_01 = this_01 + 1;
  }
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (S,(MultiFab *)&local_4b8,&local_338,&local_1b8,1,0,0x15,
             &(this->super_NavierStokesBase).super_AmrLevel.geom,&math_bc);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)S,true);
  local_930 = &local_790;
  local_928 = &S->super_FabArray<amrex::FArrayBox>;
  while (mfi.currentIndex < mfi.endIndex) {
    for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
      dir = (uint)lVar29;
      amrex::MFIter::nodaltilebox(&local_9c4,&mfi,dir);
      uVar5 = *(undefined8 *)
               ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect + 2);
      uVar6 = *(undefined8 *)
               ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect + 2);
      bx.bigend.vect[1] =
           (int)((ulong)*(undefined8 *)
                         (this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect >>
                0x20);
      bx.bigend.vect[2] = (int)uVar6;
      bx.btype.itype = SUB84(uVar6,4);
      uVar8 = bx._20_8_;
      bx.smallend.vect._0_8_ =
           *(undefined8 *)(this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect;
      bx.smallend.vect[2] = (int)uVar5;
      bx.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
      bx.btype.itype = SUB84(uVar6,4);
      uVar4 = bx.btype.itype >> (dir & 0x1f);
      bx._20_8_ = uVar8;
      if ((uVar4 & 1) == 0) {
        piVar17 = bx.bigend.vect + lVar29;
        *piVar17 = *piVar17 + 1;
        bx.btype.itype = bx.btype.itype | 1 << ((byte)lVar29 & 0x1f);
      }
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_608,&S->super_FabArray<amrex::FArrayBox>,&mfi,1);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_648,&flux[lVar29]->super_FabArray<amrex::FArrayBox>,&mfi);
      piVar17 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      this_00 = (EBCellFlagFab *)
                (S->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar17][1].super_BaseFab<double>._vptr_BaseFab;
      result.smallend.vect[1] = local_9c4.smallend.vect[1];
      result.smallend.vect[0] = local_9c4.smallend.vect[0];
      result.bigend.vect[1] = local_9c4.bigend.vect[1];
      result.bigend.vect[2] = local_9c4.bigend.vect[2];
      result.btype.itype = local_9c4.btype.itype;
      result.smallend.vect[2] = local_9c4.smallend.vect[2];
      result.bigend.vect[0] = local_9c4.bigend.vect[0];
      FVar15 = amrex::EBCellFlagFab::getType(this_00,&result);
      if (FVar15 != covered) {
        result.smallend.vect[0] = local_9c4.smallend.vect[0] + -4;
        result.smallend.vect[1] = local_9c4.smallend.vect[1] + -4;
        result.smallend.vect[2] = local_9c4.smallend.vect[2] + -4;
        result.bigend.vect[0] = local_9c4.bigend.vect[0] + 4;
        result.bigend.vect[1] = local_9c4.bigend.vect[1] + 4;
        result.bigend.vect[2] = local_9c4.bigend.vect[2] + 4;
        FVar15 = amrex::EBCellFlagFab::getType(this_00,&result);
        iVar26 = local_608.begin.z;
        uVar6 = local_608.begin._0_8_;
        LVar14 = local_608.nstride;
        LVar13 = local_608.kstride;
        LVar12 = local_608.jstride;
        pdVar31 = local_608.p;
        iVar2 = local_648.begin.z;
        uVar5 = local_648.begin._0_8_;
        LVar11 = local_648.nstride;
        LVar10 = local_648.kstride;
        LVar9 = local_648.jstride;
        local_a30 = local_648.p;
        iVar7 = local_9c4.smallend.vect[0];
        if (FVar15 == regular) {
          result.smallend.vect[0] = dir;
          result.btype.itype = (uint)local_608.kstride;
          result.smallend.vect[2] = (int)local_608.p;
          result.bigend.vect[0] = (int)((ulong)local_608.p >> 0x20);
          result.bigend.vect[1] = (int)local_608.jstride;
          result.bigend.vect[2] = (int)((ulong)local_608.jstride >> 0x20);
          *(ulong *)((long)local_930 + 0xc) = CONCAT44(bx.bigend.vect[1],bx.bigend.vect[0]);
          *(undefined8 *)((long)local_930 + 0x14) = bx._20_8_;
          *local_930 = bx.smallend.vect._0_8_;
          local_930[1] = CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]);
          aiStack_774._16_8_ = *(undefined8 *)(local_920->bc + 4);
          aiStack_774[0] = (int)*(undefined8 *)local_920->bc;
          aiStack_774[1] = (int)((ulong)*(undefined8 *)local_920->bc >> 0x20);
          aiStack_774._8_8_ = *(undefined8 *)(local_920->bc + 2);
          lVar36 = (long)local_9c4.smallend.vect[0];
          lVar37 = (long)local_9c4.smallend.vect[1];
          lVar40 = (long)local_9c4.smallend.vect[2];
          local_980 = (long)local_9c4.bigend.vect[1];
          lVar25 = (long)local_9c4.bigend.vect[2];
          local_988 = (ulong)(uint)local_9c4.bigend.vect[0];
          local_958 = CONCAT44(local_958._4_4_,local_9c4.bigend.vect[0] + 1);
          local_7b0 = (int)uVar5;
          iStack_7ac = SUB84(uVar5,4);
          local_7f0 = (int)uVar6;
          local_960 = pdVar31 + -(long)local_7f0;
          local_990 = LVar10 * 8;
          local_968 = LVar12 << 3;
          local_a30 = (double *)
                      ((lVar40 - iVar2) * LVar10 * 8 + (lVar37 - iStack_7ac) * LVar9 * 8 +
                       lVar36 * 8 + (long)local_7b0 * -8 + (long)local_a30);
          iStack_7ec = SUB84(uVar6,4);
          local_970 = CONCAT44(local_970._4_4_,iStack_7ec);
          local_978 = CONCAT44(local_978._4_4_,iVar26);
          for (; S = (MultiFab *)local_928, lVar40 <= lVar25; lVar40 = lVar40 + 1) {
            local_a00 = local_a30;
            for (lVar35 = lVar37; lVar35 <= local_980; lVar35 = lVar35 + 1) {
              if (iVar7 <= (int)local_988) {
                iVar2 = aiStack_774[lVar29];
                local_950 = CONCAT44(local_950._4_4_,aiStack_774[lVar29 + 3]);
                local_948 = lVar35;
                pdVar31 = local_a00;
                lVar30 = lVar36;
                do {
                  iVar26 = (int)lVar30;
                  id_l[0] = iVar26;
                  iVar27 = (int)local_948;
                  id_l[1] = iVar27;
                  iVar38 = (int)lVar40;
                  id_l[2] = iVar38;
                  if (iVar2 == 3) {
                    bVar44 = id_l[lVar29] <= *(int *)((long)&local_790 + lVar29 * 4);
                  }
                  else {
                    bVar44 = false;
                  }
                  if ((int)local_950 == 3) {
                    bVar3 = *(int *)((long)&uStack_788 + lVar29 * 4 + 4) <= id_l[lVar29];
                  }
                  else {
                    bVar3 = false;
                  }
                  id_l_1[0] = iVar26;
                  id_l_1[1] = iVar27;
                  id_l_1[2] = iVar38;
                  id_h[0] = iVar26;
                  id_h[1] = iVar27;
                  id_h[2] = iVar38;
                  if (bVar44) {
                    id_l_1[lVar29] = id_l_1[lVar29] + -1;
                    id_h[lVar29] = id_h[lVar29] + -1;
                    iVar27 = id_h[1];
                    iVar38 = id_h[2];
                    iVar26 = id_h[0];
                  }
                  else if (!bVar3) {
                    id_l_1[lVar29] = id_l_1[lVar29] + -1;
                  }
                  memset(local_568,0,0xa8);
                  dVar46 = 0.0;
                  dVar47 = 0.0;
                  pdVar21 = pdVar31;
                  pdVar20 = local_960;
                  for (lVar35 = 0; lVar35 != 0x15; lVar35 = lVar35 + 1) {
                    dVar46 = dVar46 + *pdVar21;
                    dVar1 = (*(double *)
                              ((long)pdVar20 +
                              (long)(id_l_1[2] - (int)local_978) * LVar13 * 8 +
                              (id_l_1[1] - (int)local_970) * local_968 + (long)id_l_1[0] * 8) +
                            *(double *)
                             ((long)pdVar20 +
                             (long)(iVar38 - (int)local_978) * LVar13 * 8 +
                             (iVar27 - (int)local_970) * local_968 + (long)iVar26 * 8)) * 0.5;
                    local_568[lVar35] = dVar1;
                    dVar47 = dVar47 + dVar1;
                    pdVar20 = pdVar20 + LVar14;
                    pdVar21 = pdVar21 + LVar11;
                  }
                  pdVar21 = pdVar31;
                  for (lVar35 = 0; lVar35 != 0x15; lVar35 = lVar35 + 1) {
                    *pdVar21 = local_568[lVar35] * -dVar46 * (1.0 / dVar47) + *pdVar21;
                    pdVar21 = pdVar21 + LVar11;
                  }
                  lVar30 = lVar30 + 1;
                  pdVar31 = pdVar31 + 1;
                  lVar35 = local_948;
                } while ((int)local_958 != (int)lVar30);
              }
              local_a00 = local_a00 + LVar9;
            }
            local_a30 = (double *)((long)local_a30 + local_990);
          }
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)id_l_1,&local_4b8 + lVar29,&mfi);
          amrex::MultiCutFab::array
                    ((Array4<const_double> *)id_h,
                     (this->super_NavierStokesBase).areafrac._M_elems[lVar29],&mfi);
          iVar27 = local_608.begin.z;
          uVar6 = local_608.begin._0_8_;
          LVar14 = local_608.nstride;
          LVar13 = local_608.kstride;
          LVar12 = local_608.jstride;
          pdVar21 = local_608.p;
          iVar26 = local_648.begin.z;
          uVar5 = local_648.begin._0_8_;
          LVar11 = local_648.nstride;
          LVar10 = local_648.kstride;
          LVar9 = local_648.jstride;
          pdVar31 = local_648.p;
          iVar2 = local_9c4.bigend.vect[0];
          iVar7 = local_9c4.smallend.vect[0];
          result.smallend.vect[0] = dir;
          result.btype.itype = (uint)local_608.kstride;
          result.smallend.vect[2] = (int)local_608.p;
          result.bigend.vect[0] = (int)((ulong)local_608.p >> 0x20);
          result.bigend.vect[1] = (int)local_608.jstride;
          result.bigend.vect[2] = (int)((ulong)local_608.jstride >> 0x20);
          *(ulong *)((long)local_930 + 0x2c) = CONCAT44(iStack_828,iStack_82c);
          *(undefined8 *)((long)local_930 + 0x34) = uStack_824;
          local_930[4] = local_838;
          local_930[5] = CONCAT44(iStack_82c,iStack_830);
          local_930[2] = local_848;
          local_930[3] = lStack_840;
          *local_930 = CONCAT44(id_l_1[1],id_l_1[0]);
          local_930[1] = CONCAT44(uStack_84c,id_l_1[2]);
          lVar35 = local_780;
          lVar40 = uStack_788;
          lVar36 = CONCAT44(id_h[1],id_h[0]);
          lVar37 = CONCAT44(uStack_67c,id_h[2]);
          local_750 = lVar36;
          lStack_748 = lVar37;
          iStack_700 = bx.bigend.vect[1];
          iStack_6fc = bx.bigend.vect[2];
          IStack_6f8.itype = bx.btype.itype;
          aiStack_710[0] = bx.smallend.vect[0];
          aiStack_710[1] = bx.smallend.vect[1];
          aiStack_710[2] = bx.smallend.vect[2];
          aiStack_710[3] = bx.bigend.vect[0];
          local_6f4._16_8_ = *(undefined8 *)(local_920->bc + 4);
          local_6f4._0_8_ = *(undefined8 *)local_920->bc;
          local_6f4._8_8_ = *(undefined8 *)(local_920->bc + 2);
          lVar39 = (long)local_9c4.smallend.vect[0];
          lVar42 = (long)local_9c4.smallend.vect[1];
          lVar30 = (long)local_9c4.smallend.vect[2];
          iStack_7ac = SUB84(uVar5,4);
          local_7f0 = (int)uVar6;
          iStack_7ec = SUB84(uVar6,4);
          lVar43 = LVar12 * 8;
          lVar18 = LVar13 * 8;
          local_978 = (long)iStack_7ec;
          local_998 = (lVar42 - iStack_7ec) * lVar43 + (lVar30 - iVar27) * lVar18 + lVar39 * 8 +
                      (long)local_7f0 * -8 + (long)pdVar21;
          local_7b0 = (int)uVar5;
          local_9a0 = (double *)
                      ((lVar30 - aiStack_774[3]) * local_780 * 8 +
                       (lVar42 - aiStack_774[2]) * uStack_788 * 8 + lVar39 * 8 +
                       (long)aiStack_774[1] * -8 + local_790);
          local_9a8 = (double *)
                      ((lVar30 - iVar26) * LVar10 * 8 + (lVar42 - iStack_7ac) * LVar9 * 8 +
                       lVar39 * 8 + (long)local_7b0 * -8 + (long)pdVar31);
          lVar25 = CONCAT44(aiStack_774[0],uStack_778);
          local_990 = (long)local_9c4.bigend.vect[1];
          lVar23 = (long)local_9c4.bigend.vect[2];
          iVar26 = local_9c4.bigend.vect[0] + 1;
          local_730 = (int)local_668;
          uVar33 = (ulong)local_730;
          local_72c = SUB84(local_668,4);
          local_980 = CONCAT44(local_980._4_4_,iVar26);
          local_988 = uVar33;
          for (; S = (MultiFab *)local_928, lVar30 <= lVar23; lVar30 = lVar30 + 1) {
            lVar19 = lVar30 - iStack_660;
            local_a08 = local_9a8;
            local_a30 = local_9a0;
            local_a10 = local_998;
            local_970 = lVar30;
            for (lVar34 = lVar42; lVar34 <= local_990; lVar34 = lVar34 + 1) {
              if (iVar7 <= iVar2) {
                iVar38 = local_6f4[lVar29];
                iVar41 = local_6f4[lVar29 + 3];
                local_950 = lVar36 + lVar19 * local_678 * 8 + (lVar34 - local_72c) * lVar37 * 8;
                local_9d0 = local_a30;
                local_958 = lVar34;
                local_960 = (double *)CONCAT44(local_960._4_4_,iVar38);
                local_968 = CONCAT44(local_968._4_4_,iVar41);
                lVar24 = lVar39;
                pdVar31 = local_a08;
                lVar32 = local_a10;
                do {
                  local_93c[0] = (int)lVar24;
                  local_93c[1] = (int)lVar34;
                  local_93c[2] = (int)lVar30;
                  if (iVar38 == 3) {
                    bVar44 = local_93c[lVar29] <= aiStack_710[lVar29];
                  }
                  else {
                    bVar44 = false;
                  }
                  if (iVar41 == 3) {
                    bVar3 = aiStack_710[lVar29 + 3] <= local_93c[lVar29];
                  }
                  else {
                    bVar3 = false;
                  }
                  id_l[0] = (int)lVar24;
                  id_l[1] = (int)lVar34;
                  id_l[2] = (int)lVar30;
                  id_l[lVar29] = id_l[lVar29] + -1;
                  local_948 = lVar24;
                  if (*(double *)(local_950 + (lVar24 - uVar33) * 8) <= 0.0) {
                    lVar24 = 0x15;
                    pdVar20 = pdVar31;
                    while (bVar44 = lVar24 != 0, lVar24 = lVar24 + -1, bVar44) {
                      *pdVar20 = 0.0;
                      pdVar20 = pdVar20 + LVar11;
                    }
                  }
                  else {
                    memset(local_568,0,0xa8);
                    dVar46 = 0.0;
                    lVar30 = 0;
                    dVar47 = 0.0;
                    pdVar20 = pdVar31;
                    pdVar28 = local_9d0;
                    for (lVar34 = 0; lVar34 != 0x15; lVar34 = lVar34 + 1) {
                      dVar46 = dVar46 + *pdVar20;
                      dVar1 = *pdVar28;
                      uVar48 = SUB84(dVar1,0);
                      uVar49 = (undefined4)((ulong)dVar1 >> 0x20);
                      local_568[lVar34] = dVar1;
                      if (bVar44) {
                        dVar1 = *(double *)
                                 ((long)pdVar21 +
                                 lVar30 * 8 +
                                 (id_l[2] - iVar27) * lVar18 + (id_l[1] - (int)local_978) * lVar43 +
                                 (long)id_l[0] * 8 + (long)local_7f0 * -8);
                        uVar48 = SUB84(dVar1,0);
                        uVar49 = (undefined4)((ulong)dVar1 >> 0x20);
                        local_568[lVar34] = dVar1;
                      }
                      if (bVar3) {
                        dVar1 = *(double *)(lVar32 + lVar30 * 8);
                        uVar48 = SUB84(dVar1,0);
                        uVar49 = (undefined4)((ulong)dVar1 >> 0x20);
                        local_568[lVar34] = dVar1;
                      }
                      dVar47 = dVar47 + (double)CONCAT44(uVar49,uVar48);
                      lVar30 = lVar30 + LVar14;
                      pdVar28 = pdVar28 + lVar25;
                      pdVar20 = pdVar20 + LVar11;
                    }
                    pdVar20 = pdVar31;
                    for (lVar24 = 0; uVar33 = local_988, lVar30 = local_970, lVar34 = local_958,
                        iVar26 = (int)local_980, iVar38 = (int)local_960, iVar41 = (int)local_968,
                        lVar24 != 0x15; lVar24 = lVar24 + 1) {
                      *pdVar20 = local_568[lVar24] * -dVar46 * (1.0 / dVar47) + *pdVar20;
                      pdVar20 = pdVar20 + LVar11;
                    }
                  }
                  lVar24 = local_948 + 1;
                  pdVar31 = pdVar31 + 1;
                  lVar32 = lVar32 + 8;
                  local_9d0 = local_9d0 + 1;
                } while (iVar26 != (int)lVar24);
              }
              local_a10 = local_a10 + lVar43;
              local_a30 = local_a30 + lVar40;
              local_a08 = local_a08 + LVar9;
            }
            local_998 = local_998 + lVar18;
            local_9a0 = local_9a0 + lVar35;
            local_9a8 = local_9a8 + LVar10;
          }
        }
      }
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  if (2 < NavierStokesBase::verbose) {
    dVar47 = amrex::ParallelDescriptor::second();
    os_ = amrex::OutStream();
    amrex::Print::Print((Print *)&result,os_);
    std::operator<<((ostream *)(result.bigend.vect + 1),
                    "      PeleLM::adjust_spec_diffusion_fluxes(): lev: ");
    pPVar22 = amrex::Print::operator<<
                        ((Print *)&result,&(this->super_NavierStokesBase).super_AmrLevel.level);
    std::operator<<((ostream *)&pPVar22->ss,", time: ");
    std::ostream::_M_insert<double>(dVar47 - dVar45);
    std::operator<<((ostream *)&pPVar22->ss,'\n');
    amrex::Print::~Print((Print *)&result);
  }
  lVar29 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)((long)&local_4b8.super_FabArrayBase._vptr_FabArrayBase + lVar29));
    lVar29 = lVar29 + -0x180;
  } while (lVar29 != -0x180);
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
            ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&math_bc);
  return;
}

Assistant:

void
PeleLM::adjust_spec_diffusion_fluxes (MultiFab* const * flux,
                                      const MultiFab&   S,
                                      const BCRec&      bc)
{
   BL_PROFILE("PLM::adjust_spec_diffusion_fluxes()");
   AMREX_ASSERT(S.nGrow() >= 1);
   // Note: S first entry is rho

   //
   // Adjust the species diffusion fluxes so that their sum is zero.
   //
   const Real strt_time = ParallelDescriptor::second();
   const Box& domain = geom.Domain();

#ifdef AMREX_USE_EB
   Vector<BCRec> math_bc(NUM_SPECIES);
   math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

   MultiFab edgstate[AMREX_SPACEDIM];
   int nghost(4);         // TODO Use 4 for now

   for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
   {
     const BoxArray& ba = getEdgeBoxArray(idim);
     edgstate[idim].define(ba, dmap, NUM_SPECIES, nghost, MFInfo(), Factory());
   }
   EB_interp_CellCentroid_to_FaceCentroid(S, AMREX_D_DECL(edgstate[0],edgstate[1],edgstate[2]), 1, 0, NUM_SPECIES, geom, math_bc);
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      for (int dir =0; dir < AMREX_SPACEDIM; ++dir)
      {
         const Box& ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         auto const& rhoY     = S.const_array(mfi,1);
         auto const& flux_dir = flux[dir]->array(mfi);

#ifdef AMREX_USE_EB
         const EBFArrayBox&  state_fab = static_cast<EBFArrayBox const&>(S[mfi]);
         const EBCellFlagFab&    flags = state_fab.getEBCellFlagFab();

         if (flags.getType(amrex::grow(ebx,0)) != FabType::covered )
         {
            // No cut cells in tile + nghost-cell witdh halo -> use non-eb routine
            if (flags.getType(amrex::grow(ebx,nghost)) == FabType::regular )
            {
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
               });
            }
            else
            {
               auto const& rhoYed_d   = edgstate[dir].array(mfi);
               auto const& areafrac_d = areafrac[dir]->array(mfi);
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, rhoYed_d, areafrac_d, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux_eb( i, j, k, dir, on_lo, on_hi, rhoY, rhoYed_d, areafrac_d, flux_dir );
               });
            }
         }
#else
         amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
         });

#endif
      }
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::adjust_spec_diffusion_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}